

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

archive_acl_entry *
acl_new_entry(archive_acl *acl,wchar_t type,wchar_t permset,wchar_t tag,wchar_t id)

{
  wchar_t in_ECX;
  wchar_t in_EDX;
  wchar_t in_ESI;
  long in_RDI;
  wchar_t in_R8D;
  archive_acl_entry *aq;
  archive_acl_entry *ap;
  archive_acl_entry *local_30;
  archive_acl_entry *local_28;
  archive_acl_entry *local_8;
  
  if ((in_ESI & 0x3c00U) == 0) {
    if ((in_ESI & 0x300U) == 0) {
      return (archive_acl_entry *)0x0;
    }
    if ((*(uint *)(in_RDI + 0x30) & 0xfffffcff) != 0) {
      return (archive_acl_entry *)0x0;
    }
    if ((in_EDX & 0xfffffff8U) != 0) {
      return (archive_acl_entry *)0x0;
    }
  }
  else {
    if ((*(uint *)(in_RDI + 0x30) & 0xffffc3ff) != 0) {
      return (archive_acl_entry *)0x0;
    }
    if ((in_EDX & 0x81ff0006U) != 0) {
      return (archive_acl_entry *)0x0;
    }
  }
  if (3 < (uint)(in_ECX + L'\xffffd8ef')) {
    if ((uint)(in_ECX + L'\xffffd8eb') < 2) {
      if ((in_ESI & 0xfffffcffU) != 0) {
        return (archive_acl_entry *)0x0;
      }
    }
    else {
      if (in_ECX != L'❻') {
        return (archive_acl_entry *)0x0;
      }
      if ((in_ESI & 0xffffc3ffU) != 0) {
        return (archive_acl_entry *)0x0;
      }
    }
  }
  if (*(long *)(in_RDI + 0x20) != 0) {
    free(*(void **)(in_RDI + 0x20));
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  if (*(long *)(in_RDI + 0x28) != 0) {
    free(*(void **)(in_RDI + 0x28));
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  local_28 = *(archive_acl_entry **)(in_RDI + 8);
  local_30 = (archive_acl_entry *)0x0;
  while( true ) {
    if (local_28 == (archive_acl_entry *)0x0) {
      local_8 = (archive_acl_entry *)malloc(0x80);
      if (local_8 == (archive_acl_entry *)0x0) {
        local_8 = (archive_acl_entry *)0x0;
      }
      else {
        memset(local_8,0,0x80);
        if (local_30 == (archive_acl_entry *)0x0) {
          *(archive_acl_entry **)(in_RDI + 8) = local_8;
        }
        else {
          local_30->next = local_8;
        }
        local_8->type = in_ESI;
        local_8->tag = in_ECX;
        local_8->id = in_R8D;
        local_8->permset = in_EDX;
        *(wchar_t *)(in_RDI + 0x30) = in_ESI | *(uint *)(in_RDI + 0x30);
      }
      return local_8;
    }
    if (((local_28->type == in_ESI) && (local_28->tag == in_ECX)) && (local_28->id == in_R8D))
    break;
    local_30 = local_28;
    local_28 = local_28->next;
  }
  local_28->permset = in_EDX;
  return local_28;
}

Assistant:

static struct archive_acl_entry *
acl_new_entry(struct archive_acl *acl,
    int type, int permset, int tag, int id)
{
	struct archive_acl_entry *ap, *aq;

	/* Type argument must be a valid NFS4 or POSIX.1e type.
	 * The type must agree with anything already set and
	 * the permset must be compatible. */
	if (type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
		if (acl->acl_types & ~ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			return (NULL);
		}
		if (permset &
		    ~(ARCHIVE_ENTRY_ACL_PERMS_NFS4
			| ARCHIVE_ENTRY_ACL_INHERITANCE_NFS4)) {
			return (NULL);
		}
	} else	if (type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) {
		if (acl->acl_types & ~ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) {
			return (NULL);
		}
		if (permset & ~ARCHIVE_ENTRY_ACL_PERMS_POSIX1E) {
			return (NULL);
		}
	} else {
		return (NULL);
	}

	/* Verify the tag is valid and compatible with NFS4 or POSIX.1e. */
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER:
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
	case ARCHIVE_ENTRY_ACL_GROUP:
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		/* Tags valid in both NFS4 and POSIX.1e */
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
	case ARCHIVE_ENTRY_ACL_OTHER:
		/* Tags valid only in POSIX.1e. */
		if (type & ~ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) {
			return (NULL);
		}
		break;
	case ARCHIVE_ENTRY_ACL_EVERYONE:
		/* Tags valid only in NFS4. */
		if (type & ~ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			return (NULL);
		}
		break;
	default:
		/* No other values are valid. */
		return (NULL);
	}

	if (acl->acl_text_w != NULL) {
		free(acl->acl_text_w);
		acl->acl_text_w = NULL;
	}
	if (acl->acl_text != NULL) {
		free(acl->acl_text);
		acl->acl_text = NULL;
	}

	/* If there's a matching entry already in the list, overwrite it. */
	ap = acl->acl_head;
	aq = NULL;
	while (ap != NULL) {
		if (ap->type == type && ap->tag == tag && ap->id == id) {
			ap->permset = permset;
			return (ap);
		}
		aq = ap;
		ap = ap->next;
	}

	/* Add a new entry to the end of the list. */
	ap = (struct archive_acl_entry *)malloc(sizeof(*ap));
	if (ap == NULL)
		return (NULL);
	memset(ap, 0, sizeof(*ap));
	if (aq == NULL)
		acl->acl_head = ap;
	else
		aq->next = ap;
	ap->type = type;
	ap->tag = tag;
	ap->id = id;
	ap->permset = permset;
	acl->acl_types |= type;
	return (ap);
}